

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

bool IsHit(bitset<32UL> flags)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (t_assoc == direct_mapped) {
    j = 0;
    uVar3 = (ulong)(uint)bit_block;
    if ((ulong)bit_line == 0) {
      current_line = 0;
      i = uVar3;
    }
    else {
      uVar4 = bit_line + uVar3;
      current_line = 0;
      j = 0;
      do {
        uVar5 = current_line & ~(1L << (j & 0x3f));
        current_line = current_line | 1L << (j & 0x3f);
        if (((ulong)flags.super__Base_bitset<1UL>._M_w >> ((ulong)((uint)bit_block + (int)j) & 0x3f)
            & 1) == 0) {
          current_line = uVar5;
        }
        lVar1 = uVar3 + j;
        j = j + 1;
      } while (lVar1 + 1U < uVar4);
      i = uVar3 + 1;
      if (uVar3 + 1 < uVar4) {
        i = uVar4;
      }
    }
    uVar3 = cache_item[current_line].super__Base_bitset<1UL>._M_w;
    if (((uint)uVar3 >> 0x1e & 1) != 0) {
      i = 0x1f;
      uVar4 = 0x1f - (ulong)bit_tag;
      j = 0x1c;
      if (0x1e < uVar4) {
        i = 0x1f;
        j = 0x1c;
        return true;
      }
      do {
        if (((uVar3 >> (j & 0x3f) & 1) != 0) !=
            (((ulong)flags.super__Base_bitset<1UL>._M_w >> ((ulong)((int)j + 3U & 0xff) & 0x3f) & 1)
            != 0)) {
          return false;
        }
        i = j + 2;
        j = j - 1;
      } while (uVar4 < i);
      j = 0x1c - (ulong)bit_tag;
      return true;
    }
  }
  else {
    if (t_assoc == set_associative) {
      j = 0;
      uVar3 = (ulong)(uint)bit_block;
      if ((ulong)bit_set == 0) {
        current_set = 0;
        i = uVar3;
      }
      else {
        uVar4 = bit_set + uVar3;
        current_set = 0;
        j = 0;
        do {
          uVar5 = current_set & ~(1L << (j & 0x3f));
          current_set = current_set | 1L << (j & 0x3f);
          if (((ulong)flags.super__Base_bitset<1UL>._M_w >>
               ((ulong)((uint)bit_block + (int)j) & 0x3f) & 1) == 0) {
            current_set = uVar5;
          }
          lVar1 = uVar3 + j;
          j = j + 1;
        } while (lVar1 + 1U < uVar4);
        i = uVar3 + 1;
        if (uVar3 + 1 < uVar4) {
          i = uVar4;
        }
      }
      temp = i_cache_set * current_set;
      uVar3 = (current_set + 1) * i_cache_set;
      if (uVar3 <= temp) {
        return false;
      }
      uVar4 = 0x1f - (ulong)bit_tag;
      bVar2 = false;
      do {
        uVar5 = cache_item[temp].super__Base_bitset<1UL>._M_w;
        if (((uint)uVar5 >> 0x1e & 1) != 0) {
          i = 0x1f;
          bVar2 = true;
          uVar6 = 0x1c;
          j = uVar6;
          if (uVar4 < 0x1f) {
            do {
              if (((uVar5 >> (uVar6 & 0x3f) & 1) != 0) !=
                  (((ulong)flags.super__Base_bitset<1UL>._M_w >>
                    ((ulong)((int)uVar6 + 3U & 0xff) & 0x3f) & 1) != 0)) {
                bVar2 = false;
                j = uVar6;
                break;
              }
              i = uVar6 + 2;
              uVar6 = uVar6 - 1;
              j = 0x1c - (ulong)bit_tag;
            } while (uVar4 < i);
          }
        }
        if (bVar2) {
          current_line = temp;
          return bVar2;
        }
        temp = temp + 1;
        if (temp == uVar3) {
          temp = uVar3;
          return bVar2;
        }
      } while( true );
    }
    if (t_assoc == full_associative) {
      if (i_num_line == 0) {
        temp = 0;
        return false;
      }
      uVar3 = 0x1f - (ulong)bit_tag;
      bVar2 = false;
      temp = 0;
      do {
        uVar4 = cache_item[temp].super__Base_bitset<1UL>._M_w;
        if (((uint)uVar4 >> 0x1e & 1) != 0) {
          i = 0x1f;
          bVar2 = true;
          uVar5 = 0x1c;
          j = uVar5;
          if (uVar3 < 0x1f) {
            do {
              if (((uVar4 >> (uVar5 & 0x3f) & 1) != 0) !=
                  (((ulong)flags.super__Base_bitset<1UL>._M_w >>
                    ((ulong)((int)uVar5 + 3U & 0xff) & 0x3f) & 1) != 0)) {
                bVar2 = false;
                j = uVar5;
                break;
              }
              i = uVar5 + 2;
              uVar5 = uVar5 - 1;
              j = 0x1c - (ulong)bit_tag;
            } while (uVar3 < i);
          }
        }
        if (bVar2) {
          current_line = temp;
          return bVar2;
        }
        temp = temp + 1;
        if (temp == i_num_line) {
          temp = i_num_line;
          return bVar2;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool IsHit(bitset<32> flags)
{
    bool ret = false;

    if(t_assoc == direct_mapped)
    {
        bitset<32> flags_line; // a temp variable

        for(j=0,i=(bit_block); i<(bit_block+bit_line); j++,i++) //判断在cache多少行
        {
            flags_line[j] = flags[i];
        }

        current_line = flags_line.to_ulong();
        assert(cache_item[current_line][31] == true);

        if(cache_item[current_line][30]) //判断hit位是否为真
        {
            ret = true;

            for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
            {
                if(flags[i] != cache_item[current_line][j])
                {
                    ret = false;
                    break;
                }
            }
        }
    }
    else if(t_assoc == full_associative)
    {
        for(temp=0; temp<i_num_line; temp++)
        {
            if(cache_item[temp][30]) //判断hit位是否为真
            {
                ret = true;

                for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
                {
                    if(flags[i] != cache_item[temp][j])
                    {
                        ret = false;
                        break;
                    }
                }
            }

            if(ret)
            {
                current_line = temp;
                break;
            }
        }
    }
    else if(t_assoc == set_associative)
    {
        bitset<32> flags_set;

        for(j=0,i=(bit_block); i<(bit_block+bit_set); j++,i++) //判断在cache多少组
        {
            flags_set[j] = flags[i];
        }

        current_set = flags_set.to_ulong();

        for(temp=(current_set*i_cache_set); temp<((current_set+1)*i_cache_set); temp++)
        {
            if(cache_item[temp][30]) //判断hit位是否为真
            {
                ret = true;

                for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
                {
                    if(flags[i] != cache_item[temp][j])
                    {
                        ret = false;
                        break;
                    }
                }
            }

            if(ret)
            {
                current_line = temp;
                break;
            }
        }
    }

    return ret;
}